

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O1

void __thiscall NaPetriNet::add(NaPetriNet *this,NaPetriNode *pNode)

{
  NaPNodePtrAr *pNVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar6;
  char *pcVar7;
  NaPetriConnector *pNVar8;
  undefined8 *puVar9;
  ulong uVar10;
  char *pcVar11;
  FILE *pFVar12;
  int local_3c;
  
  iVar3 = (this->pnaNet).nItems;
  bVar2 = 0 < iVar3;
  if (0 < iVar3) {
    pNVar1 = &this->pnaNet;
    iVar3 = (*(this->pnaNet)._vptr_NaDynAr[0xf])(pNVar1,0);
    if (*(NaPetriNode **)CONCAT44(extraout_var,iVar3) == pNode) {
      return;
    }
    uVar10 = 1;
    do {
      iVar3 = (this->pnaNet).nItems;
      iVar4 = (int)uVar10;
      bVar2 = iVar4 < iVar3;
      if (iVar3 <= iVar4) break;
      iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar10);
      uVar10 = (ulong)(iVar4 + 1);
    } while (*(NaPetriNode **)CONCAT44(extraout_var_00,iVar3) != pNode);
  }
  if (bVar2) {
    return;
  }
  if ((this->fpDig != (FILE *)0x0) && (iVar3 = NaPetriNode::connectors(pNode), 0 < iVar3)) {
    pFVar12 = (FILE *)this->fpDig;
    pcVar6 = NaPetriNode::name(pNode);
    pcVar7 = NaPetriNode::name(pNode);
    local_3c = 0;
    fprintf(pFVar12,"  %s [\n    label=\"%s|{",pcVar6,pcVar7);
    iVar3 = NaPetriNode::connectors(pNode);
    if (0 < iVar3) {
      local_3c = 0;
      iVar3 = 0;
      do {
        pNVar8 = NaPetriNode::connector(pNode,iVar3);
        iVar4 = (*pNVar8->_vptr_NaPetriConnector[7])(pNVar8);
        if (iVar4 == 0) {
          pFVar12 = (FILE *)this->fpDig;
          pcVar6 = NaPetriConnector::name(pNVar8);
          pcVar7 = NaPetriConnector::name(pNVar8);
          pcVar11 = "|<%s>%s";
          if (local_3c == 0) {
            pcVar11 = "{<%s>%s";
          }
          fprintf(pFVar12,pcVar11,pcVar6,pcVar7);
          local_3c = local_3c + 1;
        }
        iVar3 = iVar3 + 1;
        iVar4 = NaPetriNode::connectors(pNode);
      } while (iVar3 < iVar4);
    }
    if (0 < local_3c) {
      fputc(0x7d,(FILE *)this->fpDig);
    }
    iVar3 = NaPetriNode::connectors(pNode);
    if (0 < iVar3) {
      iVar3 = 0;
      iVar4 = 0;
      do {
        pNVar8 = NaPetriNode::connector(pNode,iVar3);
        iVar5 = (*pNVar8->_vptr_NaPetriConnector[7])(pNVar8);
        if (iVar5 == 1) {
          if (iVar4 == 0 && local_3c == 0) {
            pFVar12 = (FILE *)this->fpDig;
            pcVar6 = NaPetriConnector::name(pNVar8);
            pcVar7 = NaPetriConnector::name(pNVar8);
            pcVar11 = "{<%s>%s";
          }
          else {
            pFVar12 = (FILE *)this->fpDig;
            pcVar6 = NaPetriConnector::name(pNVar8);
            pcVar7 = NaPetriConnector::name(pNVar8);
            if (iVar4 == 0) {
              pcVar11 = "|{<%s>%s";
            }
            else {
              pcVar11 = "|<%s>%s";
            }
          }
          fprintf(pFVar12,pcVar11,pcVar6,pcVar7);
          iVar4 = iVar4 + 1;
        }
        iVar3 = iVar3 + 1;
        iVar5 = NaPetriNode::connectors(pNode);
      } while (iVar3 < iVar5);
      if (0 < iVar4) {
        fputc(0x7d,(FILE *)this->fpDig);
      }
    }
    fwrite("}\"\n  ] ;\n",9,1,(FILE *)this->fpDig);
  }
  pcVar6 = this->szName;
  pcVar7 = NaPetriNode::name(pNode);
  NaPrintLog(" %s: + %s node\n",pcVar6,pcVar7);
  puVar9 = (undefined8 *)operator_new(8);
  *puVar9 = pNode;
  (*(this->pnaNet)._vptr_NaDynAr[4])(&this->pnaNet,puVar9);
  pNode->pNet = this;
  (*pNode->_vptr_NaPetriNode[10])(pNode);
  return;
}

Assistant:

void
NaPetriNet::add (NaPetriNode* pNode)
{
    if(ask_for_node(pNode)){
        // Don't add the same node twice
        return;
    }

    if(NULL != fpDig) {
	if(pNode->connectors() > 0) {
	    fprintf(fpDig, "  %s [\n    label=\"%s|{",
		    pNode->name(), pNode->name());
	    int nInputs = 0;
	    for(int i = 0; i < pNode->connectors(); ++i) {
		NaPetriConnector *pCn = pNode->connector(i);
		if(pckInput == pCn->kind()) {
		    if(0 == nInputs)
			fprintf(fpDig, "{<%s>%s", pCn->name(), pCn->name());
		    else
			fprintf(fpDig, "|<%s>%s", pCn->name(), pCn->name());
		    ++nInputs;
		}
	    }
	    if(nInputs > 0)
		fprintf(fpDig, "}");
	    int nOutputs = 0;
	    for(int i = 0; i < pNode->connectors(); ++i) {
		NaPetriConnector *pCn = pNode->connector(i);
		if(pckOutput == pCn->kind()) {
		    if(0 == nOutputs && 0 == nInputs)
			fprintf(fpDig, "{<%s>%s", pCn->name(), pCn->name());
		    else if(0 == nOutputs)
			fprintf(fpDig, "|{<%s>%s", pCn->name(), pCn->name());
		    else
			fprintf(fpDig, "|<%s>%s", pCn->name(), pCn->name());
		    ++nOutputs;
		}
	    }
	    if(nOutputs > 0)
		fprintf(fpDig, "}");
	    fprintf(fpDig, "}\"\n  ] ;\n");
	}
    }

    NaPrintLog(" %s: + %s node\n", name(), pNode->name());

    pnaNet.addh(pNode);

    // Setup pointer to the network
    pNode->pNet = this;

    // Perform some actions in new attendee
    pNode->attend_network();
}